

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

QString * __thiscall
QtPrivate::QCalendarDateValidator::currentText(QCalendarDateValidator *this,QCalendar cal)

{
  qsizetype qVar1;
  size_type sVar2;
  const_reference pvVar3;
  undefined8 in_RDX;
  QList<QString> *in_RSI;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  SectionToken *token;
  int i;
  int numTokens;
  int numSeps;
  QString *str;
  QString *in_stack_ffffffffffffff68;
  QList<QString> *__n;
  int local_70;
  undefined1 local_40 [24];
  undefined1 local_28 [24];
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  __n = in_RDI;
  local_10 = in_RDX;
  QString::QString((QString *)0x5170bf);
  qVar1 = QList<QString>::size(in_RSI);
  sVar2 = std::vector<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>::size
                    ((vector<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_> *)
                     (in_RSI + 1));
  for (local_70 = 0; local_70 < (int)qVar1; local_70 = local_70 + 1) {
    QList<QString>::at(in_RDI,(qsizetype)in_stack_ffffffffffffff68);
    QString::operator+=((QString *)in_RDI,in_stack_ffffffffffffff68);
    if (local_70 < (int)sVar2) {
      pvVar3 = std::vector<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>::
               operator[]((vector<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>
                           *)in_RSI,(size_type)__n);
      if (local_70 == *(int *)&in_RSI[6].d.d) {
        (*pvVar3->validator->_vptr_QCalendarDateSectionValidator[5])(local_28);
        QString::operator+=((QString *)in_RDI,in_stack_ffffffffffffff68);
        QString::~QString((QString *)0x517183);
      }
      else {
        (*pvVar3->validator->_vptr_QCalendarDateSectionValidator[6])
                  (local_40,pvVar3->validator,in_RSI[6].d.size,local_10,(ulong)(uint)pvVar3->repeat)
        ;
        QString::operator+=((QString *)in_RDI,in_stack_ffffffffffffff68);
        QString::~QString((QString *)0x5171e2);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)__n;
  }
  __stack_chk_fail();
}

Assistant:

QString QCalendarDateValidator::currentText(QCalendar cal) const
{
    QString str;
    const int numSeps = m_separators.size();
    const int numTokens = int(m_tokens.size());
    for (int i = 0; i < numSeps; ++i) {
        str += m_separators.at(i);
        if (i < numTokens) {
            const SectionToken &token = m_tokens[i];
            if (i == m_currentToken)
                str += token.validator->text();
            else
                str += token.validator->text(m_currentDate, cal, token.repeat);
        }
    }
    return str;
}